

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar1;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar2;
  float fVar3;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar8;
  
  if (action != 1) {
    return;
  }
  cameraSpeed = deltaTime * 500.0;
  aVar8 = cameraFront.field_1;
  aVar4 = cameraFront.field_2;
  aVar1 = cameraPos.field_0;
  aVar2 = cameraPos.field_1;
  switch(key) {
  case 0x31:
    curMotion = ONE;
    return;
  case 0x32:
    curMotion = TWO;
    return;
  case 0x33:
    curMotion = THREE;
    return;
  case 0x34:
    curMotion = FOUR;
    return;
  case 0x35:
    curMotion = FIVE;
    return;
  case 0x36:
    curMotion = SIX;
    return;
  case 0x37:
    curMotion = SEVEN;
    return;
  case 0x38:
    bingoFlag = 0;
    cur_passed_time = passed_time;
    curMotion = EIGHT;
    return;
  case 0x39:
    curMotion = NINE;
    return;
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x43:
  case 0x45:
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x54:
    return;
  case 0x41:
    fVar5 = cameraUp.field_2.z * aVar8.y - aVar4.z * cameraUp.field_1.y;
    fVar6 = cameraUp.field_0.x * aVar4.z - cameraFront.field_0.x * cameraUp.field_2.z;
    fVar3 = cameraFront.field_0.x * cameraUp.field_1.y - aVar8.y * cameraUp.field_0.x;
    fVar7 = 1.0 / SQRT(fVar6 * fVar6 + fVar5 * fVar5 + fVar3 * fVar3);
    aVar4.z = fVar3 * fVar7;
    cameraPos.field_0.x = aVar1.x + cameraSpeed * fVar7 * fVar5;
    cameraPos.field_1.y = aVar2.y + cameraSpeed * fVar7 * fVar6;
    break;
  case 0x42:
    bingoFlag = 0;
    cur_passed_time = passed_time;
    curMotion = BINGO;
    return;
  case 0x44:
    fVar5 = cameraUp.field_2.z * aVar8.y - aVar4.z * cameraUp.field_1.y;
    fVar6 = cameraUp.field_0.x * aVar4.z - cameraFront.field_0.x * cameraUp.field_2.z;
    fVar3 = cameraFront.field_0.x * cameraUp.field_1.y - aVar8.y * cameraUp.field_0.x;
    fVar7 = 1.0 / SQRT(fVar6 * fVar6 + fVar5 * fVar5 + fVar3 * fVar3);
    aVar4.z = fVar3 * fVar7;
    cameraPos.field_0.x = aVar1.x - cameraSpeed * fVar7 * fVar5;
    cameraPos.field_1.y = aVar2.y - cameraSpeed * fVar7 * fVar6;
    goto LAB_00130a98;
  case 0x47:
    curMotion = GRASP;
    return;
  case 0x4f:
    curMotion = OK;
    return;
  case 0x53:
    cameraPos.field_0.x = aVar1.x + cameraSpeed * cameraUp.field_0.x;
    cameraPos.field_1.y = aVar2.y + cameraSpeed * cameraUp.field_1.y;
    aVar4 = cameraUp.field_2;
    break;
  case 0x55:
    bingoFlag = 0;
    cur_passed_time = passed_time;
    curMotion = GUN;
    return;
  case 0x56:
    curMotion = WAVE;
    return;
  case 0x57:
    cameraPos.field_0.x = aVar1.x - cameraSpeed * cameraUp.field_0.x;
    cameraPos.field_1.y = aVar2.y - cameraSpeed * cameraUp.field_1.y;
    aVar4 = cameraUp.field_2;
LAB_00130a98:
    cameraPos.field_2.z = cameraPos.field_2.z - aVar4.z * cameraSpeed;
    return;
  default:
    if (key == 0x20) {
      if (curMotion == PAUSE) {
        curMotion = motionBeforePause;
        return;
      }
      motionBeforePause = curMotion;
      curMotion = PAUSE;
      return;
    }
    if (key != 0x100) {
      return;
    }
    glfwSetWindowShouldClose(window,1);
    return;
  }
  cameraPos.field_2.z = aVar4.z * cameraSpeed + cameraPos.field_2.z;
  return;
}

Assistant:

static void key_callback(GLFWwindow *window, int key, int scancode, int action, int mods) {
    if(action == GLFW_PRESS){
        cameraSpeed = 500.0f*deltaTime;
        switch(key){
            case GLFW_KEY_ESCAPE:
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            case GLFW_KEY_W://图像向上
                cameraPos -= cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_S://图像向下
                cameraPos += cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_A://图像向左
                cameraPos += glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_D://图像向右
                cameraPos -= glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_G://GRASP
                curMotion = GRASP;
                break;
            case GLFW_KEY_V://WAVE
                curMotion = WAVE;
                break;
            case GLFW_KEY_O://OK
                curMotion = OK;
                break;
            case GLFW_KEY_B://BINGO
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = BINGO;
                break;
            case GLFW_KEY_U://GUN
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = GUN;
                break;
            case GLFW_KEY_1:
                curMotion = ONE;
                break;
            case GLFW_KEY_2:
                curMotion = TWO;
                break;
            case GLFW_KEY_3:
                curMotion = THREE;
                break;
            case GLFW_KEY_4:
                curMotion = FOUR;
                break;
            case GLFW_KEY_5:
                curMotion = FIVE;
                break;
            case GLFW_KEY_6:
                curMotion = SIX;
                break;
            case GLFW_KEY_7:
                curMotion = SEVEN;
                break;
            case GLFW_KEY_8:
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = EIGHT;
                break;
            case GLFW_KEY_9:
                curMotion = NINE;
                break;
            case GLFW_KEY_SPACE:
                if(curMotion != PAUSE) {
                    motionBeforePause = curMotion;
                    curMotion = PAUSE;
                } else{
                    curMotion = motionBeforePause;
                }
            default:
                break;
        }
    }
}